

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

event_base * event_base_new_with_config(event_config *cfg)

{
  __suseconds_t _Var1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  event_base *base;
  char *pcVar6;
  void *pvVar7;
  long lVar8;
  event_config_entry *peVar9;
  eventop *peVar10;
  timeval tmp;
  timeval local_78 [4];
  
  event_debug_mode_too_late = 1;
  base = (event_base *)event_mm_calloc_(1,0x298);
  if (base == (event_base *)0x0) {
    event_warn("%s: calloc","event_base_new_with_config");
    return (event_base *)0x0;
  }
  if (cfg == (event_config *)0x0) {
    bVar2 = 0;
    bVar3 = false;
  }
  else {
    base->flags = cfg->flags;
    bVar2 = (byte)((char)cfg->flags & EVENT_BASE_FLAG_IGNORE_ENV) >> 1;
    bVar3 = (bool)((byte)((char)cfg->flags & EVENT_BASE_FLAG_PRECISE_TIMER) >> 5);
  }
  if (bVar2 == 0 && bVar3 == false) {
    pcVar6 = evutil_getenv_("EVENT_PRECISE_TIMER");
    bVar3 = pcVar6 != (char *)0x0;
    if (bVar3) {
      *(undefined1 *)&base->flags = (char)base->flags | EVENT_BASE_FLAG_PRECISE_TIMER;
      bVar3 = true;
    }
  }
  evutil_configure_monotonic_time_(&base->monotonic_timer,(uint)bVar3);
  gettime(base,local_78);
  (base->timeheap).p = (event **)0x0;
  (base->timeheap).n = 0;
  (base->timeheap).a = 0;
  (base->sig).ev_signal_pair[0] = -1;
  (base->sig).ev_signal_pair[1] = -1;
  base->th_notify_fd[0] = -1;
  base->th_notify_fd[1] = -1;
  (base->active_later_queue).tqh_first = (event_callback *)0x0;
  (base->active_later_queue).tqh_last = &(base->active_later_queue).tqh_first;
  evmap_io_initmap_(&base->io);
  evmap_signal_initmap_(&base->sigmap);
  event_changelist_init_(&base->changelist);
  base->evbase = (void *)0x0;
  if (cfg == (event_config *)0x0) {
    (base->max_dispatch_time).tv_sec = -1;
    iVar5 = 1;
  }
  else {
    _Var1 = (cfg->max_dispatch_interval).tv_usec;
    (base->max_dispatch_time).tv_sec = (cfg->max_dispatch_interval).tv_sec;
    (base->max_dispatch_time).tv_usec = _Var1;
    iVar5 = cfg->limit_callbacks_after_prio;
  }
  base->limit_callbacks_after_prio = iVar5;
  if ((cfg == (event_config *)0x0) || (iVar5 = cfg->max_dispatch_callbacks, iVar5 < 0)) {
    iVar5 = 0x7fffffff;
  }
  base->max_dispatch_callbacks = iVar5;
  if ((iVar5 == 0x7fffffff) && ((base->max_dispatch_time).tv_sec == -1)) {
    base->limit_callbacks_after_prio = 0x7fffffff;
  }
  peVar10 = &epollops;
  lVar8 = 0;
  do {
    if (base->evbase != (void *)0x0) break;
    if (cfg == (event_config *)0x0) {
LAB_001de7ea:
      if (bVar2 == 0) {
        evutil_snprintf((char *)local_78,0x40,"EVENT_NO%s",peVar10->name);
        if ((char)local_78[0].tv_usec != '\0') {
          pcVar6 = (char *)((long)&local_78[0].tv_usec + 1);
          cVar4 = (char)local_78[0].tv_usec;
          do {
            cVar4 = EVUTIL_TOUPPER_(cVar4);
            pcVar6[-1] = cVar4;
            cVar4 = *pcVar6;
            pcVar6 = pcVar6 + 1;
          } while (cVar4 != '\0');
        }
        pcVar6 = evutil_getenv_((char *)local_78);
        if (pcVar6 != (char *)0x0) goto LAB_001de84e;
      }
      base->evsel = peVar10;
      pvVar7 = (*peVar10->init)(base);
      base->evbase = pvVar7;
    }
    else {
      peVar9 = (cfg->entries).tqh_first;
      if (peVar9 != (event_config_entry *)0x0) {
        pcVar6 = peVar10->name;
        do {
          if ((peVar9->avoid_method != (char *)0x0) &&
             (iVar5 = strcmp(peVar9->avoid_method,pcVar6), iVar5 == 0)) goto LAB_001de84e;
          peVar9 = (peVar9->next).tqe_next;
        } while (peVar9 != (event_config_entry *)0x0);
      }
      if ((cfg->require_features & ~peVar10->features) == 0) goto LAB_001de7ea;
    }
LAB_001de84e:
    peVar10 = eventops[lVar8 + 1];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  if (base->evbase == (void *)0x0) {
    event_warnx("%s: no event mechanism available","event_base_new_with_config");
    base->evsel = (eventop *)0x0;
  }
  else {
    pcVar6 = evutil_getenv_("EVENT_SHOW_METHOD");
    if (pcVar6 != (char *)0x0) {
      event_msgx("libevent using: %s",base->evsel->name);
    }
    iVar5 = event_base_priority_init(base,1);
    if (-1 < iVar5) {
      event_debug_created_threadable_ctx_ = 1;
      if (evthread_lock_fns_.lock == (_func_int_uint_void_ptr *)0x0) {
        event_debug_created_threadable_ctx_ = 1;
        return base;
      }
      if ((cfg != (event_config *)0x0) && ((cfg->flags & EVENT_BASE_FLAG_NOLOCK) != 0)) {
        event_debug_created_threadable_ctx_ = 1;
        return base;
      }
      if (evthread_lock_fns_.alloc == (_func_void_ptr_uint *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = (*evthread_lock_fns_.alloc)(0);
      }
      base->th_base_lock = pvVar7;
      if (evthread_cond_fns_.alloc_condition == (_func_void_ptr_uint *)0x0) {
        pvVar7 = (void *)0x0;
      }
      else {
        pvVar7 = (*evthread_cond_fns_.alloc_condition)(0);
      }
      base->current_event_cond = pvVar7;
      iVar5 = evthread_make_base_notifiable(base);
      if (-1 < iVar5) {
        return base;
      }
      event_warnx("%s: Unable to make base notifiable.","event_base_new_with_config");
    }
  }
  event_base_free_(base,1);
  return (event_base *)0x0;
}

Assistant:

struct event_base *
event_base_new_with_config(const struct event_config *cfg)
{
	int i;
	struct event_base *base;
	int should_check_environment;

#ifndef EVENT__DISABLE_DEBUG_MODE
	event_debug_mode_too_late = 1;
#endif

	if ((base = mm_calloc(1, sizeof(struct event_base))) == NULL) {
		event_warn("%s: calloc", __func__);
		return NULL;
	}

	if (cfg)
		base->flags = cfg->flags;

	should_check_environment =
	    !(cfg && (cfg->flags & EVENT_BASE_FLAG_IGNORE_ENV));

	{
		struct timeval tmp;
		int precise_time =
		    cfg && (cfg->flags & EVENT_BASE_FLAG_PRECISE_TIMER);
		int flags;
		if (should_check_environment && !precise_time) {
			precise_time = evutil_getenv_("EVENT_PRECISE_TIMER") != NULL;
			if (precise_time) {
				base->flags |= EVENT_BASE_FLAG_PRECISE_TIMER;
			}
		}
		flags = precise_time ? EV_MONOT_PRECISE : 0;
		evutil_configure_monotonic_time_(&base->monotonic_timer, flags);

		gettime(base, &tmp);
	}

	min_heap_ctor_(&base->timeheap);

	base->sig.ev_signal_pair[0] = -1;
	base->sig.ev_signal_pair[1] = -1;
	base->th_notify_fd[0] = -1;
	base->th_notify_fd[1] = -1;

	TAILQ_INIT(&base->active_later_queue);

	evmap_io_initmap_(&base->io);
	evmap_signal_initmap_(&base->sigmap);
	event_changelist_init_(&base->changelist);

	base->evbase = NULL;

	if (cfg) {
		memcpy(&base->max_dispatch_time,
		    &cfg->max_dispatch_interval, sizeof(struct timeval));
		base->limit_callbacks_after_prio =
		    cfg->limit_callbacks_after_prio;
	} else {
		base->max_dispatch_time.tv_sec = -1;
		base->limit_callbacks_after_prio = 1;
	}
	if (cfg && cfg->max_dispatch_callbacks >= 0) {
		base->max_dispatch_callbacks = cfg->max_dispatch_callbacks;
	} else {
		base->max_dispatch_callbacks = INT_MAX;
	}
	if (base->max_dispatch_callbacks == INT_MAX &&
	    base->max_dispatch_time.tv_sec == -1)
		base->limit_callbacks_after_prio = INT_MAX;

	for (i = 0; eventops[i] && !base->evbase; i++) {
		if (cfg != NULL) {
			/* determine if this backend should be avoided */
			if (event_config_is_avoided_method(cfg,
				eventops[i]->name))
				continue;
			if ((eventops[i]->features & cfg->require_features)
			    != cfg->require_features)
				continue;
		}

		/* also obey the environment variables */
		if (should_check_environment &&
		    event_is_method_disabled(eventops[i]->name))
			continue;

		base->evsel = eventops[i];

		base->evbase = base->evsel->init(base);
	}

	if (base->evbase == NULL) {
		event_warnx("%s: no event mechanism available",
		    __func__);
		base->evsel = NULL;
		event_base_free(base);
		return NULL;
	}

	if (evutil_getenv_("EVENT_SHOW_METHOD"))
		event_msgx("libevent using: %s", base->evsel->name);

	/* allocate a single active event queue */
	if (event_base_priority_init(base, 1) < 0) {
		event_base_free(base);
		return NULL;
	}

	/* prepare for threading */

#if !defined(EVENT__DISABLE_THREAD_SUPPORT) && !defined(EVENT__DISABLE_DEBUG_MODE)
	event_debug_created_threadable_ctx_ = 1;
#endif

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (EVTHREAD_LOCKING_ENABLED() &&
	    (!cfg || !(cfg->flags & EVENT_BASE_FLAG_NOLOCK))) {
		int r;
		EVTHREAD_ALLOC_LOCK(base->th_base_lock, 0);
		EVTHREAD_ALLOC_COND(base->current_event_cond);
		r = evthread_make_base_notifiable(base);
		if (r<0) {
			event_warnx("%s: Unable to make base notifiable.", __func__);
			event_base_free(base);
			return NULL;
		}
	}
#endif

#ifdef _WIN32
	if (cfg && (cfg->flags & EVENT_BASE_FLAG_STARTUP_IOCP))
		event_base_start_iocp_(base, cfg->n_cpus_hint);
#endif

	return (base);
}